

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QString * __thiscall QUrl::authority(QUrl *this,ComponentFormattingOptions options)

{
  long lVar1;
  bool bVar2;
  undefined4 in_EDX;
  QUrlPrivate *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  FormattingOptions in_stack_0000001c;
  QString *result;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  QMessageLogger *this_00;
  Section in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  uint3 in_stack_ffffffffffffffb4;
  uint uVar3;
  QUrlPrivate *this_01;
  QMessageLogger local_30;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (uint)in_stack_ffffffffffffffb4;
  *(undefined1 **)&in_RDI->context = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->context).file = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->context).function = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  this_01 = in_RSI;
  local_c = in_EDX;
  QString::QString((QString *)0x2fb41b);
  lVar1._0_4_ = in_RSI->ref;
  lVar1._4_4_ = in_RSI->port;
  if (lVar1 != 0) {
    local_10 = local_c;
    bVar2 = ::operator==((QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
                         SUB84((ulong)in_RDI >> 0x20,0),
                         (ComponentFormattingOption)in_stack_ffffffffffffff80);
    if (bVar2) {
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                 in_stack_ffffffffffffff78);
      QMessageLogger::warning
                (&local_30,"QUrl::authority(): QUrl::FullyDecoded is not permitted in this function"
                );
    }
    else {
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (*(QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> **)
                  in_RSI,(QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>)
                         SUB84((ulong)in_RDI >> 0x20,0));
      QUrlPrivate::appendAuthority
                (this_01,(QString *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),in_stack_0000001c,
                 in_stack_ffffffffffffffaf);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrl::authority(ComponentFormattingOptions options) const
{
    QString result;
    if (!d)
        return result;

    if (options == QUrl::FullyDecoded) {
        qWarning("QUrl::authority(): QUrl::FullyDecoded is not permitted in this function");
        return result;
    }

    d->appendAuthority(result, options, QUrlPrivate::Authority);
    return result;
}